

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O3

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
               (Matrix<double,_33,_33,_1,_33,_33> *result,
               ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ChQuadratureTables *pCVar12;
  ulong uVar13;
  pointer pdVar14;
  double *pdVar15;
  undefined8 uVar16;
  Index index;
  ulong uVar17;
  pointer pdVar18;
  pointer pdVar19;
  ulong uVar20;
  ulong uVar21;
  ActualDstType actualDst;
  ulong uVar22;
  ulong uVar23;
  pointer pvVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Matrix<double,_33,_33,_1,_33,_33> val;
  ChQuadratureTables *local_2278;
  pointer local_2248;
  double local_2238 [1088];
  double local_38;
  
  pCVar12 = GetStaticTables();
  uVar22 = ((long)(pCVar12->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar12->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar22 < (uint)order) {
    local_2278 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_2278,order,order);
    ChQuadratureTables::PrintTables(local_2278);
    local_2248 = (local_2278->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pvVar24 = (local_2278->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_2278 = GetStaticTables();
    pvVar24 = (local_2278->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_2248 = (local_2278->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  bVar25 = ((ulong)result & 8) != 0;
  if (bVar25) {
    uVar13 = 0x441;
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
               m_data.array[0] * 0.0;
  }
  else {
    uVar13 = 0x440;
  }
  uVar17 = (ulong)bVar25;
  dVar7 = (Yb - Ya) * 0.5;
  dVar8 = (Xb - Xa) * 0.5;
  dVar9 = (Zb - Za) * 0.5;
  do {
    pdVar15 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
              m_data.array + uVar17;
    dVar10 = pdVar15[1];
    pdVar1 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar17;
    *pdVar1 = *pdVar15 * 0.0;
    pdVar1[1] = dVar10 * 0.0;
    uVar17 = uVar17 + 2;
  } while (uVar17 < uVar13);
  if (((ulong)result & 8) == 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[uVar13] =
         (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data
         .array[uVar13] * 0.0;
  }
  pdVar14 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar18 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pdVar18 != pdVar14) {
    uVar13 = 0;
    do {
      pdVar19 = pdVar14;
      if (pdVar18 != pdVar14) {
        uVar17 = 0;
        do {
          pdVar19 = pdVar18;
          if ((long)pdVar18 - (long)pdVar14 == 0) break;
          uVar20 = (long)pdVar18 - (long)pdVar14 >> 3;
          uVar23 = 0;
          do {
            uVar21 = uVar13;
            if ((uVar20 <= uVar13) || (uVar21 = uVar17, uVar20 <= uVar17)) {
LAB_006ddd41:
              uVar16 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar21);
              operator_delete(pvVar24,0x30);
              _Unwind_Resume(uVar16);
            }
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pdVar14[uVar13];
            auVar27._8_8_ = 0;
            auVar27._0_8_ = (Xa + Xb) * 0.5;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = (Ya + Yb) * 0.5;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = (Za + Zb) * 0.5;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = dVar8;
            auVar3 = vfmadd132sd_fma(auVar26,auVar27,auVar3);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = pdVar14[uVar17];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = dVar7;
            auVar4 = vfmadd132sd_fma(auVar28,auVar29,auVar4);
            auVar30._8_8_ = 0;
            auVar30._0_8_ = pdVar14[uVar23];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = dVar9;
            auVar5 = vfmadd132sd_fma(auVar30,auVar31,auVar5);
            (*integrand->_vptr_ChIntegrable3D[2])
                      (auVar3._0_8_,auVar4._0_8_,auVar5._0_8_,integrand,local_2238);
            lVar6 = *(long *)&(local_2248->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl;
            uVar20 = (long)(local_2248->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                           .super__Vector_impl_data._M_finish - lVar6 >> 3;
            uVar21 = uVar13;
            if ((uVar20 <= uVar13) ||
               ((uVar21 = uVar17, uVar20 <= uVar17 || (uVar21 = uVar23, uVar20 <= uVar23))))
            goto LAB_006ddd41;
            dVar10 = *(double *)(lVar6 + uVar13 * 8) * *(double *)(lVar6 + uVar17 * 8) *
                     *(double *)(lVar6 + uVar23 * 8);
            bVar25 = ((ulong)local_2238 & 8) != 0;
            if (bVar25) {
              uVar20 = 0x441;
              pdVar15 = (double *)&stack0xffffffffffffffd0;
              local_2238[0] = dVar10 * local_2238[0];
            }
            else {
              uVar20 = 0x440;
              pdVar15 = &local_38;
            }
            uVar21 = (ulong)bVar25;
            do {
              local_2238[uVar21] = dVar10 * local_2238[uVar21];
              local_2238[uVar21 + 1] = dVar10 * local_2238[uVar21 + 1];
              uVar21 = uVar21 + 2;
            } while (uVar21 < uVar20);
            if (((ulong)local_2238 & 8) == 0) {
              *pdVar15 = dVar10 * *pdVar15;
            }
            if (((ulong)result & 8) == 0) {
              uVar20 = 0x440;
              uVar21 = 0;
              pdVar15 = &local_38;
            }
            else {
              uVar20 = 0x441;
              uVar21 = 1;
              pdVar15 = (double *)&stack0xffffffffffffffd0;
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
              m_data.array[0] =
                   local_2238[0] +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                   m_storage.m_data.array[0];
            }
            do {
              dVar10 = local_2238[uVar21 + 1];
              pdVar1 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                       m_storage.m_data.array + uVar21;
              dVar11 = pdVar1[1];
              pdVar2 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                       m_storage.m_data.array + uVar21;
              *pdVar2 = local_2238[uVar21] + *pdVar1;
              pdVar2[1] = dVar10 + dVar11;
              uVar21 = uVar21 + 2;
            } while (uVar21 < uVar20);
            if (((ulong)result & 8) == 0) {
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
              m_data.array[uVar20] =
                   *pdVar15 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                   m_storage.m_data.array[uVar20];
            }
            pdVar18 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            pdVar14 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar23 = (ulong)((int)uVar23 + 1);
            uVar20 = (long)pdVar18 - (long)pdVar14 >> 3;
          } while (uVar23 < uVar20);
          uVar17 = (ulong)((int)uVar17 + 1);
          pdVar19 = pdVar18;
        } while (uVar17 < uVar20);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      pdVar18 = pdVar19;
    } while (uVar13 < (ulong)((long)pdVar19 - (long)pdVar14 >> 3));
  }
  dVar9 = dVar7 * dVar8 * dVar9;
  bVar25 = ((ulong)result & 8) != 0;
  if (bVar25) {
    uVar13 = 0x441;
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0] = dVar9 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                       m_storage.m_data.array[0];
  }
  else {
    uVar13 = 0x440;
  }
  uVar17 = (ulong)bVar25;
  do {
    pdVar15 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
              m_data.array + uVar17;
    dVar7 = pdVar15[1];
    pdVar1 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar17;
    *pdVar1 = dVar9 * *pdVar15;
    pdVar1[1] = dVar9 * dVar7;
    uVar17 = uVar17 + 2;
  } while (uVar17 < uVar13);
  if (((ulong)result & 8) == 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[uVar13] =
         dVar9 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                 m_storage.m_data.array[uVar13];
  }
  if (uVar22 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2278->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2278->Weight);
    operator_delete(local_2278,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }